

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_cleanup(CPState *cp)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  long in_RDI;
  global_State *g;
  
  uVar3 = (ulong)*(uint *)(*(long *)(in_RDI + 0x38) + 8);
  uVar1 = *(undefined4 *)(in_RDI + 0x30);
  uVar2 = *(int *)(in_RDI + 0x2c) - *(int *)(in_RDI + 0x30);
  *(uint *)(uVar3 + 0x50) = *(int *)(uVar3 + 0x50) - uVar2;
  *(ulong *)(uVar3 + 0x90) = (ulong)uVar2 + *(long *)(uVar3 + 0x90);
  (**(code **)(uVar3 + 0x40))(*(undefined8 *)(uVar3 + 0x48),uVar1,(ulong)uVar2,0);
  return;
}

Assistant:

static void cp_cleanup(CPState *cp)
{
  global_State *g = G(cp->L);
  lj_buf_free(g, &cp->sb);
}